

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void aa_ret_summary(aa_ret_object obj)

{
  aa_ret_object obj_local;
  
  if (obj->otype == 2) {
    sarimax_wrapper_summary(obj->Arima);
  }
  else if (obj->otype == 1) {
    myarima_summary(obj->myarima);
  }
  else {
    printf("aa_ret Error \n");
  }
  return;
}

Assistant:

void aa_ret_summary(aa_ret_object obj) {
	if (obj->otype == 2) {
		sarimax_wrapper_summary(obj->Arima);
	} else if (obj->otype == 1) {
		myarima_summary(obj->myarima);
	} else {
		printf("aa_ret Error \n");
	}
}